

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_TestFailure_StringsEqualFailureWithNewLinesAndTabs_TestShell::createTest
          (TEST_TestFailure_StringsEqualFailureWithNewLinesAndTabs_TestShell *this)

{
  TEST_TestFailure_StringsEqualFailureWithNewLinesAndTabs_Test *this_00;
  
  this_00 = (TEST_TestFailure_StringsEqualFailureWithNewLinesAndTabs_Test *)
            operator_new(0x10,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
                         ,0xd1);
  TEST_TestFailure_StringsEqualFailureWithNewLinesAndTabs_Test::
  TEST_TestFailure_StringsEqualFailureWithNewLinesAndTabs_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(TestFailure, StringsEqualFailureWithNewLinesAndTabs)
{
    StringEqualFailure f(test, failFileName, failLineNumber,
            "StringWith\t\nDifferentString",
            "StringWith\t\ndifferentString", "");

    FAILURE_EQUAL("expected <StringWith\\t\\nDifferentString>\n"
                "\tbut was  <StringWith\\t\\ndifferentString>\n"
                "\tdifference starts at position 12 at: <ngWith\\t\\ndifferentS>\n"
                "\t                                                ^", f);
}